

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O3

bool pstore::command_line::details::
     parse_command_line_options<std::_List_iterator<std::__cxx11::string>,std::__cxx11::ostringstream,std::__cxx11::ostringstream>
               (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first_arg,
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               last_arg,string *overview,
               basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *outs,
               basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs)

{
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_arg_00;
  pointer pcVar1;
  bool bVar2;
  string program_name;
  help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_> help
  ;
  name local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  
  first_arg_00._M_node = (first_arg._M_node)->_M_next;
  path::posix::base_name(&local_120,(string *)(first_arg._M_node + 1));
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,local_120._M_dataplus._M_p,
             local_120._M_dataplus._M_p + local_120._M_string_length);
  pcVar1 = (overview->_M_dataplus)._M_p;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar1,pcVar1 + overview->_M_string_length);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"help","");
  name::name(&local_1a0,&local_160);
  help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help<pstore::command_line::name>(&local_100,&local_180,&local_140,outs,&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1a0.name_._M_dataplus._M_p._1_7_,local_1a0.name_._M_dataplus._M_p._0_1_) !=
      &local_1a0.name_.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1a0.name_._M_dataplus._M_p._1_7_,
                             local_1a0.name_._M_dataplus._M_p._0_1_),
                    local_1a0.name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  parse_option_arguments<std::_List_iterator<std::__cxx11::string>,std::__cxx11::ostringstream>
            ((details *)&local_1a0,first_arg_00,last_arg,&local_120,errs);
  if (local_1a0.name_._M_dataplus._M_p._0_1_ != (details)0x0) {
    bVar2 = parse_positional_arguments<std::_List_iterator<std::__cxx11::string>>
                      ((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_1a0.name_._M_string_length,last_arg);
    if (bVar2) {
      bVar2 = check_for_missing<std::__cxx11::ostringstream>(&local_120,errs);
      goto LAB_0012cb47;
    }
  }
  bVar2 = false;
LAB_0012cb47:
  help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~help(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool parse_command_line_options (InputIterator first_arg, InputIterator last_arg,
                                             std::string const & overview, OutputStream & outs,
                                             ErrorStream & errs) {
                std::string const program_name = pstore::path::base_name (*(first_arg++));
                help<OutputStream> const help (program_name, overview, outs, name ("help"));

                bool ok = true;
                std::tie (first_arg, ok) =
                    parse_option_arguments (first_arg, last_arg, program_name, errs);
                if (!ok) {
                    return false;
                }
                if (!parse_positional_arguments (first_arg, last_arg)) {
                    return false;
                }
                return check_for_missing (program_name, errs);
            }